

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::TParseContext::handleReturnValue(TParseContext *this,TSourceLoc *loc,TIntermTyped *value)

{
  TType *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *expression;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TIntermTyped *converted;
  TIntermBranch *branch;
  TIntermTyped *value_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  storage16BitAssignmentCheck(this,loc,(TType *)CONCAT44(extraout_var,iVar3),"return");
  (this->super_TParseContextBase).functionReturnsValue = true;
  iVar3 = (*((this->super_TParseContextBase).currentFunctionType)->_vptr_TType[7])();
  if (iVar3 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"void function cannot return a value","return","");
    converted = (TIntermTyped *)
                TIntermediate::addBranch
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpReturn,loc);
    goto LAB_0075e33e;
  }
  pTVar1 = (this->super_TParseContextBase).currentFunctionType;
  iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var_00,iVar3));
  if (bVar2) {
    expression = TIntermediate::addConversion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpReturn,(this->super_TParseContextBase).currentFunctionType,value);
    if (expression == (TIntermTyped *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "type does not match, or is not convertible to, the function\'s return type",
                 "return","");
      converted = (TIntermTyped *)
                  TIntermediate::addBranch
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             EOpReturn,value,loc);
    }
    else {
      pTVar1 = (this->super_TParseContextBase).currentFunctionType;
      iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var_01,iVar3));
      if (bVar2) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot convert return value to function return type","return","");
      }
      if ((this->super_TParseContextBase).super_TParseVersions.version < 0x1a4) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,
                   "type conversion on return values was not explicitly allowed until version 420",
                   "return","");
      }
      converted = (TIntermTyped *)
                  TIntermediate::addBranch
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             EOpReturn,expression,loc);
    }
    goto LAB_0075e33e;
  }
  iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x168))();
  if ((uVar5 & 1) == 0) {
    iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x158))();
    if ((uVar5 & 1) != 0) goto LAB_0075e2a7;
  }
  else {
LAB_0075e2a7:
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
      uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_bindless_texture");
      if ((uVar4 & 1) == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "sampler or image can be used as return type only when the extension GL_ARB_bindless_texture enabled"
                   ,"return","");
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"sampler or image cannot be used as return type when generating SPIR-V",
                 "return","");
    }
  }
  converted = (TIntermTyped *)
              TIntermediate::addBranch
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpReturn
                         ,value,loc);
LAB_0075e33e:
  iVar3 = (*((this->super_TParseContextBase).currentFunctionType)->_vptr_TType[0xb])();
  TIntermBranch::updatePrecision
            ((TIntermBranch *)converted,
             (TPrecisionQualifier)(*(ulong *)(CONCAT44(extraout_var_04,iVar3) + 8) >> 0x19) & 7);
  return &converted->super_TIntermNode;
}

Assistant:

TIntermNode* TParseContext::handleReturnValue(const TSourceLoc& loc, TIntermTyped* value)
{
    storage16BitAssignmentCheck(loc, value->getType(), "return");

    functionReturnsValue = true;
    TIntermBranch* branch = nullptr;
    if (currentFunctionType->getBasicType() == EbtVoid) {
        error(loc, "void function cannot return a value", "return", "");
        branch = intermediate.addBranch(EOpReturn, loc);
    } else if (*currentFunctionType != value->getType()) {
        TIntermTyped* converted = intermediate.addConversion(EOpReturn, *currentFunctionType, value);
        if (converted) {
            if (*currentFunctionType != converted->getType())
                error(loc, "cannot convert return value to function return type", "return", "");
            if (version < 420)
                warn(loc, "type conversion on return values was not explicitly allowed until version 420",
                     "return", "");
            branch = intermediate.addBranch(EOpReturn, converted, loc);
        } else {
            error(loc, "type does not match, or is not convertible to, the function's return type", "return", "");
            branch = intermediate.addBranch(EOpReturn, value, loc);
        }
    } else {
        if (value->getType().isTexture() || value->getType().isImage()) {
            if (spvVersion.spv != 0)
                error(loc, "sampler or image cannot be used as return type when generating SPIR-V", "return", "");
            else if (!extensionTurnedOn(E_GL_ARB_bindless_texture))
                error(loc, "sampler or image can be used as return type only when the extension GL_ARB_bindless_texture enabled", "return", "");
        }
        branch = intermediate.addBranch(EOpReturn, value, loc);
    }
    branch->updatePrecision(currentFunctionType->getQualifier().precision);
    return branch;
}